

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlcdfil.c
# Opt level: O0

FT_Error FT_Library_SetLcdGeometry(FT_Library library,FT_Vector *sub)

{
  FT_Vector *sub_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (sub == (FT_Vector *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    memcpy(library->lcd_geometry,sub,0x30);
    library_local._4_4_ = 0;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Library_SetLcdGeometry( FT_Library  library,
                             FT_Vector   sub[3] )
  {
    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !sub )
      return FT_THROW( Invalid_Argument );

    ft_memcpy( library->lcd_geometry, sub, 3 * sizeof( FT_Vector ) );

    return FT_Err_Ok;
  }